

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O1

Vec3f __thiscall embree::getVec3f(embree *this,char **token)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  Vec3f VVar7;
  
  pcVar2 = *token;
  sVar1 = strspn(pcVar2," \t");
  pcVar2 = pcVar2 + sVar1;
  *token = pcVar2;
  dVar6 = atof(pcVar2);
  VVar7.field_0._0_4_ = (float)dVar6;
  sVar1 = strcspn(pcVar2," \t\r");
  pcVar2 = pcVar2 + sVar1;
  *token = pcVar2;
  sVar1 = strspn(pcVar2," \t");
  pcVar3 = pcVar2 + sVar1;
  *token = pcVar3;
  fVar4 = VVar7.field_0._0_4_;
  fVar5 = VVar7.field_0._0_4_;
  if (pcVar2[sVar1] != '\0') {
    sVar1 = strspn(pcVar3," \t");
    pcVar3 = pcVar3 + sVar1;
    *token = pcVar3;
    dVar6 = atof(pcVar3);
    fVar4 = (float)dVar6;
    sVar1 = strcspn(pcVar3," \t\r");
    pcVar3 = pcVar3 + sVar1;
    *token = pcVar3;
    sVar1 = strspn(pcVar3," \t");
    pcVar3 = pcVar3 + sVar1;
    *token = pcVar3;
    dVar6 = atof(pcVar3);
    fVar5 = (float)dVar6;
    sVar1 = strcspn(pcVar3," \t\r");
    *token = pcVar3 + sVar1;
  }
  VVar7.field_0.field_0.y = 0.0;
  *(float *)this = VVar7.field_0._0_4_;
  *(float *)(this + 4) = fVar4;
  *(float *)(this + 8) = fVar5;
  VVar7.field_0.field_0.z = fVar4;
  return (Vec3f)VVar7.field_0;
}

Assistant:

static inline Vec3f getVec3f(const char*& token) {
    float x = getFloat(token);
    token += strspn(token, " \t");
    if (*token == 0) return Vec3f(x);
    float y = getFloat(token);
    float z = getFloat(token);
    return Vec3f(x,y,z);
  }